

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::image::anon_unknown_0::SizeTest::createInstance(SizeTest *this,Context *context)

{
  Texture *pTVar1;
  ImageType IVar2;
  VkFormat VVar3;
  deUint32 dVar4;
  VkImage image;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data_00;
  VkImageSubresourceRange subresourceRange;
  VkImageType VVar5;
  VkImageViewType imageViewType;
  SizeTestInstance *this_00;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  Allocator *pAVar8;
  VkDeviceSize bufferSize;
  Buffer *this_01;
  Image *this_02;
  Buffer *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  RefBase<vk::Handle<(vk::HandleType)12>_> local_d8;
  Texture *local_b0;
  undefined1 local_a8 [16];
  deUint32 local_98;
  VkImageCreateInfo imageParams;
  
  IVar2 = (this->m_texture).m_type;
  this_00 = (SizeTestInstance *)operator_new(0xd8);
  if (IVar2 == IMAGE_TYPE_BUFFER) {
    SizeTestInstance::SizeTestInstance(this_00,context,&this->m_texture,this->m_format);
    (this_00->super_TestInstance)._vptr_TestInstance =
         (_func_int **)&PTR__BufferSizeTestInstance_00c06de8;
    this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    pTVar1 = &this_00[1].m_texture;
    this_00[1].m_texture.m_layerSize.m_data[0] = 0;
    this_00[1].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[1].m_texture.m_numLayers = 0;
    this_00[1].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[1].m_format = 0;
    this_00[1].m_resultBufferSizeBytes = 0;
    this_00[1].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[1].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_00[2].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_00[2].super_TestInstance.m_context = (Context *)0x0;
    this_00[2].m_texture.m_layerSize.m_data[0] = 0;
    this_00[2].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[2].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[2].m_texture.m_numLayers = 0;
    this_00[2].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[2].m_format = 0;
    this_00[2].m_resultBufferSizeBytes = 0;
    this_00[2].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[2].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    pDVar6 = Context::getDeviceInterface((this_00->super_TestInstance).m_context);
    pVVar7 = Context::getDevice((this_00->super_TestInstance).m_context);
    pAVar8 = Context::getDefaultAllocator((this_00->super_TestInstance).m_context);
    Texture::size((Texture *)&imageParams);
    bufferSize = getImageSizeBytes((IVec3 *)&imageParams,this_00->m_format);
    this_01 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&imageParams,bufferSize,8);
    image::Buffer::Buffer
              (this_01,pDVar6,pVVar7,pAVar8,(VkBufferCreateInfo *)&imageParams,
               (MemoryRequirement)0x0);
    local_d8.m_data.object.m_internal = 0;
    data._8_8_ = in_stack_ffffffffffffff00;
    data.ptr = in_stack_fffffffffffffef8;
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::assignData
              ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
               (this_00 + 1),data);
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
    ~UniqueBase((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_d8
               );
    makeBufferView((Move<vk::Handle<(vk::HandleType)12>_> *)&local_d8,pDVar6,pVVar7,
                   (VkBuffer)this_00[1].super_TestInstance._vptr_TestInstance[2],this_00->m_format,0
                   ,bufferSize);
    imageParams._16_8_ = local_d8.m_data.deleter.m_device;
    imageParams.format = (VkFormat)local_d8.m_data.deleter.m_allocator;
    imageParams.extent.width = (deUint32)((ulong)local_d8.m_data.deleter.m_allocator >> 0x20);
    imageParams._0_8_ = local_d8.m_data.object.m_internal;
    imageParams.pNext = local_d8.m_data.deleter.m_deviceIface;
    local_d8.m_data.object.m_internal = 0;
    local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_d8.m_data.deleter.m_device = (VkDevice)0x0;
    local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)12>_> *)pTVar1);
    this_00[1].m_texture.m_numLayers = imageParams.flags;
    this_00[1].m_texture.m_numSamples = imageParams.imageType;
    *(ulong *)&this_00[1].m_format = CONCAT44(imageParams.extent.width,imageParams.format);
    (pTVar1->m_layerSize).m_data[0] = imageParams.sType;
    (pTVar1->m_layerSize).m_data[1] = imageParams._4_4_;
    *(void **)(this_00[1].m_texture.m_layerSize.m_data + 2) = imageParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase(&local_d8);
  }
  else {
    SizeTestInstance::SizeTestInstance(this_00,context,&this->m_texture,this->m_format);
    (this_00->super_TestInstance)._vptr_TestInstance =
         (_func_int **)&PTR__ImageSizeTestInstance_00c06e98;
    this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    local_b0 = &this_00[1].m_texture;
    this_00[1].m_texture.m_layerSize.m_data[0] = 0;
    this_00[1].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[1].m_texture.m_numLayers = 0;
    this_00[1].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[1].m_format = 0;
    this_00[1].m_resultBufferSizeBytes = 0;
    this_00[1].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[1].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_00[2].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_00[2].super_TestInstance.m_context = (Context *)0x0;
    this_00[2].m_texture.m_layerSize.m_data[0] = 0;
    this_00[2].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[2].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[2].m_texture.m_numLayers = 0;
    this_00[2].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[2].m_format = 0;
    this_00[2].m_resultBufferSizeBytes = 0;
    this_00[2].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[2].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    pDVar6 = Context::getDeviceInterface((this_00->super_TestInstance).m_context);
    pVVar7 = Context::getDevice((this_00->super_TestInstance).m_context);
    pAVar8 = Context::getDefaultAllocator((this_00->super_TestInstance).m_context);
    this_02 = (Image *)operator_new(0x30);
    imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    imageParams.pNext = (void *)0x0;
    VVar3 = this_00->m_format;
    IVar2 = (this_00->m_texture).m_type;
    imageParams.flags = (uint)(IVar2 - IMAGE_TYPE_CUBE < 2) << 4;
    VVar5 = mapImageType(IVar2);
    imageParams.imageType = VVar5;
    imageParams.format = VVar3;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_a8,&(this_00->m_texture).m_layerSize);
    imageParams.extent.width = (deUint32)local_a8._0_8_;
    imageParams.extent.height = SUB84(local_a8._0_8_,4);
    imageParams.extent.depth = local_a8._8_4_;
    imageParams.mipLevels = 1;
    imageParams.arrayLayers = (this_00->m_texture).m_numLayers;
    imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
    imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
    imageParams.usage = 8;
    imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    imageParams.queueFamilyIndexCount = 0;
    imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
    imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    Image::Image(this_02,pDVar6,pVVar7,pAVar8,&imageParams,(MemoryRequirement)0x0);
    local_d8.m_data.object.m_internal = 0;
    data_00._8_8_ = in_stack_ffffffffffffff00;
    data_00.ptr = (Image *)in_stack_fffffffffffffef8;
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::assignData
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
               (this_00 + 1),data_00);
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniqueBase
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_d8);
    dVar4 = (this_00->m_texture).m_numLayers;
    image.m_internal = (deUint64)this_00[1].super_TestInstance._vptr_TestInstance[2];
    imageViewType = mapImageViewType((this_00->m_texture).m_type);
    local_a8._0_4_ = 1;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 1;
    subresourceRange.levelCount = 1;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.aspectMask = 1;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.layerCount = dVar4;
    local_98 = dVar4;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_d8,pDVar6,pVVar7,image,
                  imageViewType,this_00->m_format,subresourceRange);
    pTVar1 = local_b0;
    imageParams._16_8_ = local_d8.m_data.deleter.m_device;
    imageParams.format = (VkFormat)local_d8.m_data.deleter.m_allocator;
    imageParams.extent.width = (deUint32)((ulong)local_d8.m_data.deleter.m_allocator >> 0x20);
    imageParams._0_8_ = local_d8.m_data.object.m_internal;
    imageParams.pNext = local_d8.m_data.deleter.m_deviceIface;
    local_d8.m_data.object.m_internal = 0;
    local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_d8.m_data.deleter.m_device = (VkDevice)0x0;
    local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_b0);
    pTVar1->m_numLayers = imageParams.flags;
    pTVar1->m_numSamples = imageParams.imageType;
    *(ulong *)(pTVar1 + 1) = CONCAT44(imageParams.extent.width,imageParams.format);
    (pTVar1->m_layerSize).m_data[0] = imageParams.sType;
    (pTVar1->m_layerSize).m_data[1] = imageParams._4_4_;
    *(void **)((pTVar1->m_layerSize).m_data + 2) = imageParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&local_d8);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* SizeTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferSizeTestInstance(context, m_texture, m_format);
	else
		return new ImageSizeTestInstance(context, m_texture, m_format);
}